

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void op_flat_append(c2m_ctx_t c2m_ctx,node_t_conflict n,node_t_conflict op)

{
  node_t pnVar1;
  node_t elem;
  
  if (op->code == N_LIST) {
    elem = (op->u).ops.head;
    while (elem != (node_t_conflict)0x0) {
      pnVar1 = (elem->op_link).next;
      DLIST_node_t_remove(&(op->u).ops,elem);
      op_append(c2m_ctx,n,elem);
      elem = pnVar1;
    }
    return;
  }
  op_append(c2m_ctx,n,op);
  return;
}

Assistant:

static void op_flat_append (c2m_ctx_t c2m_ctx, node_t n, node_t op) {
  if (op->code != N_LIST) {
    op_append (c2m_ctx, n, op);
    return;
  }
  for (node_t next_el, el = NL_HEAD (op->u.ops); el != NULL; el = next_el) {
    next_el = NL_NEXT (el);
    NL_REMOVE (op->u.ops, el);
    op_append (c2m_ctx, n, el);
  }
}